

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O3

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::scheme::SchemeImplementation>::
remove_thread(MicrothreadManager<implementations::scheme::SchemeImplementation> *this,
             ThreadId thread_ref)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _threads_iterator thread;
  bool bVar3;
  
  p_Var2 = (this->threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  thread._M_node = &(this->threads)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var1 = thread._M_node;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      bVar3 = p_Var2[1]._M_color < thread_ref;
      if (!bVar3) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar3];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((p_Var1 != thread._M_node) && (p_Var1[1]._M_color <= thread_ref)) {
      thread._M_node = p_Var1;
    }
  }
  thread_remove_scheduling(this,thread);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>,_std::_Select1st<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>_>_>_>
  ::_M_erase_aux(&(this->threads)._M_t,(const_iterator)thread._M_node);
  return;
}

Assistant:

void remove_thread(const ThreadId thread_ref) {
				auto thread = getThread(thread_ref);
				thread_remove_scheduling(thread);
				threads.erase(thread);
			}